

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall NLReaderTest_ReadVarBounds_Test::TestBody(NLReaderTest_ReadVarBounds_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  ReadError *e_4;
  bool gtest_caught_expected_4;
  string gtest_expected_message_4;
  AssertionResult gtest_ar_5;
  ReadError *e_3;
  bool gtest_caught_expected_3;
  string gtest_expected_message_3;
  AssertionResult gtest_ar_4;
  ReadError *e_2;
  bool gtest_caught_expected_2;
  string gtest_expected_message_2;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  ReadError *e_1;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_1;
  ReadError *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa70;
  char (*in_stack_fffffffffffffa78) [50];
  char *in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa88;
  int in_stack_fffffffffffffa8c;
  char *in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa98;
  Type in_stack_fffffffffffffa9c;
  AssertionResult *in_stack_fffffffffffffaa0;
  undefined7 in_stack_fffffffffffffaa8;
  undefined1 in_stack_fffffffffffffaaf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffab0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Message *in_stack_fffffffffffffae8;
  AssertHelper *in_stack_fffffffffffffaf0;
  undefined1 local_379 [33];
  string local_358 [38];
  byte local_332;
  undefined1 local_331 [33];
  AssertionResult local_310 [3];
  allocator<char> local_2d9;
  string local_2d8 [32];
  string local_2b8 [38];
  byte local_292;
  allocator<char> local_291;
  string local_290 [32];
  AssertionResult local_270 [3];
  allocator<char> local_239;
  string local_238 [32];
  string local_218 [38];
  byte local_1f2;
  allocator<char> local_1f1;
  string local_1f0 [23];
  undefined1 in_stack_fffffffffffffe27;
  string *in_stack_fffffffffffffe28;
  AssertionResult local_1d0 [2];
  allocator<char> local_1a9;
  string local_1a8 [32];
  string local_188 [32];
  AssertionResult local_168 [3];
  allocator<char> local_131;
  string local_130 [32];
  string local_110 [38];
  byte local_ea;
  allocator<char> local_e9;
  string local_e8 [32];
  AssertionResult local_c8 [3];
  int local_98;
  allocator<char> local_91;
  string local_90 [32];
  string local_70 [38];
  byte local_4a;
  allocator<char> local_49;
  string local_48 [48];
  AssertionResult local_18;
  
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffab0,
               (char *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (allocator<char> *)in_stack_fffffffffffffaa0);
    std::allocator<char>::~allocator(&local_49);
    local_4a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffab0,
                 (char *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
                 (allocator<char> *)in_stack_fffffffffffffaa0);
      ReadNL(in_stack_fffffffffffffe28,(bool)in_stack_fffffffffffffe27);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator(&local_91);
    }
    if ((local_4a & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffaa0,
                 (char (*) [96])CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
      local_98 = 2;
    }
    else {
      local_98 = 0;
    }
    std::__cxx11::string::~string(local_48);
    if (local_98 != 0) goto LAB_0015d3a6;
  }
  else {
LAB_0015d3a6:
    testing::Message::Message((Message *)in_stack_fffffffffffffaa0);
    testing::AssertionResult::failure_message((AssertionResult *)0x15d3c2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c,
               in_stack_fffffffffffffa90,in_stack_fffffffffffffa8c,in_stack_fffffffffffffa80);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa70);
    testing::Message::~Message((Message *)0x15d425);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15d47d);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffab0,
               (char *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (allocator<char> *)in_stack_fffffffffffffaa0);
    std::allocator<char>::~allocator(&local_e9);
    local_ea = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffab0,
                 (char *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
                 (allocator<char> *)in_stack_fffffffffffffaa0);
      ReadNL(in_stack_fffffffffffffe28,(bool)in_stack_fffffffffffffe27);
      std::__cxx11::string::~string(local_110);
      std::__cxx11::string::~string(local_130);
      std::allocator<char>::~allocator(&local_131);
    }
    if ((local_ea & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffaa0,
                 (char (*) [92])CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
      local_98 = 3;
    }
    else {
      local_98 = 0;
    }
    std::__cxx11::string::~string(local_e8);
    if (local_98 != 0) goto LAB_0015d8a9;
  }
  else {
LAB_0015d8a9:
    testing::Message::Message((Message *)in_stack_fffffffffffffaa0);
    testing::AssertionResult::failure_message((AssertionResult *)0x15d8c5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c,
               in_stack_fffffffffffffa90,in_stack_fffffffffffffa8c,in_stack_fffffffffffffa80);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa70);
    testing::Message::~Message((Message *)0x15d928);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15d980);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffab0,
             (char *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
             (allocator<char> *)in_stack_fffffffffffffaa0);
  ReadNL(in_stack_fffffffffffffe28,(bool)in_stack_fffffffffffffe27);
  testing::internal::EqHelper<false>::Compare<char[50],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
             in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
  std::__cxx11::string::~string(local_188);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_168);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffaa0);
    testing::AssertionResult::failure_message((AssertionResult *)0x15dafd);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c,
               in_stack_fffffffffffffa90,in_stack_fffffffffffffa8c,in_stack_fffffffffffffa80);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa70);
    testing::Message::~Message((Message *)0x15db60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15dbb8);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1d0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffab0,
               (char *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (allocator<char> *)in_stack_fffffffffffffaa0);
    std::allocator<char>::~allocator(&local_1f1);
    local_1f2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffab0,
                 (char *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
                 (allocator<char> *)in_stack_fffffffffffffaa0);
      ReadNL(in_stack_fffffffffffffe28,(bool)in_stack_fffffffffffffe27);
      std::__cxx11::string::~string(local_218);
      std::__cxx11::string::~string(local_238);
      std::allocator<char>::~allocator(&local_239);
    }
    if ((local_1f2 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffaa0,
                 (char (*) [103])CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
      local_98 = 4;
    }
    else {
      local_98 = 0;
    }
    std::__cxx11::string::~string(local_1f0);
    if (local_98 != 0) goto LAB_0015dfe1;
  }
  else {
LAB_0015dfe1:
    testing::Message::Message((Message *)in_stack_fffffffffffffaa0);
    testing::AssertionResult::failure_message((AssertionResult *)0x15dffd);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c,
               in_stack_fffffffffffffa90,in_stack_fffffffffffffa8c,in_stack_fffffffffffffa80);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa70);
    testing::Message::~Message((Message *)0x15e060);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15e0b8);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_270);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffab0,
               (char *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (allocator<char> *)in_stack_fffffffffffffaa0);
    std::allocator<char>::~allocator(&local_291);
    local_292 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffab0,
                 (char *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
                 (allocator<char> *)in_stack_fffffffffffffaa0);
      ReadNL(in_stack_fffffffffffffe28,(bool)in_stack_fffffffffffffe27);
      std::__cxx11::string::~string(local_2b8);
      std::__cxx11::string::~string(local_2d8);
      std::allocator<char>::~allocator(&local_2d9);
    }
    if ((local_292 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffaa0,
                 (char (*) [104])CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
      local_98 = 5;
    }
    else {
      local_98 = 0;
    }
    std::__cxx11::string::~string(local_290);
    if (local_98 != 0) goto LAB_0015e4cf;
  }
  else {
LAB_0015e4cf:
    testing::Message::Message((Message *)in_stack_fffffffffffffaa0);
    testing::AssertionResult::failure_message((AssertionResult *)0x15e4eb);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c,
               in_stack_fffffffffffffa90,in_stack_fffffffffffffa8c,in_stack_fffffffffffffa80);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa70);
    testing::Message::~Message((Message *)0x15e548);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15e5a0);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_310);
  if (bVar1) {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_331;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (allocator<char> *)in_stack_fffffffffffffaa0);
    std::allocator<char>::~allocator((allocator<char> *)local_331);
    local_332 = 0;
    uVar2 = testing::internal::AlwaysTrue();
    if ((bool)uVar2) {
      in_stack_fffffffffffffaa0 = (AssertionResult *)local_379;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)CONCAT17(uVar2,in_stack_fffffffffffffaa8),
                 (allocator<char> *)in_stack_fffffffffffffaa0);
      ReadNL(in_stack_fffffffffffffe28,(bool)in_stack_fffffffffffffe27);
      std::__cxx11::string::~string(local_358);
      std::__cxx11::string::~string((string *)(local_379 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_379);
    }
    if ((local_332 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffaa0,
                 (char (*) [120])CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
      local_98 = 6;
    }
    else {
      local_98 = 0;
    }
    std::__cxx11::string::~string((string *)(local_331 + 1));
    if (local_98 == 0) goto LAB_0015ea46;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffaa0);
  testing::AssertionResult::failure_message((AssertionResult *)0x15e9a3);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c,
             in_stack_fffffffffffffa90,in_stack_fffffffffffffa8c,in_stack_fffffffffffffa80);
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa70);
  testing::Message::~Message((Message *)0x15e9fe);
LAB_0015ea46:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15ea53);
  return;
}

Assistant:

TEST(NLReaderTest, ReadVarBounds) {
  EXPECT_THROW_MSG(ReadNL("", false), ReadError,
                   "(input):11:1: segment 'b' missing");
  EXPECT_THROW_MSG(ReadNL("b\n"), ReadError,
                   "(input):17:1: duplicate 'b' segment");
  EXPECT_EQ("1.1 <= v0; v1 <= 22; v2 = 33; v3; 44 <= v4 <= 55;",
            ReadNL("b\n21.1\n1 22\n4 33\n3\n0 44 55\n", false));
  EXPECT_THROW_MSG(ReadNL("b\n-1\n", false), ReadError,
                   "(input):12:1: expected bound");
  EXPECT_THROW_MSG(ReadNL("b\n5 1\n", false), ReadError,
                   "(input):12:1: COMPL bound type is invalid for variables");
  EXPECT_THROW_MSG(ReadNL("b\n2 11\n1 22\n4 33\n3\n", false), ReadError,
                   "(input):16:1: expected bound");
}